

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_edge.h
# Opt level: O3

uint __thiscall tri_cc_t::fnext(tri_cc_t *this,uint t)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *this_00;
  ulong uVar3;
  ulong uVar4;
  stringstream ss;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  uVar4 = (ulong)t;
  uVar3 = ((long)(this->m_tris).super__Vector_base<tri_cc_t::tri,_std::allocator<tri_cc_t::tri>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_tris).super__Vector_base<tri_cc_t::tri,_std::allocator<tri_cc_t::tri>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  if (uVar4 <= uVar3 && uVar3 - uVar4 != 0) {
    bVar1 = has_fnext(this,t);
    if (bVar1) {
      return (this->m_tris).super__Vector_base<tri_cc_t::tri,_std::allocator<tri_cc_t::tri>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar4].fnext;
    }
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Failed to assert condition ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"is_in_range(t,0,m_tris.size()) && has_fnext(t)",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"at (",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,
             "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/tri_edge.h"
             ,0x5e);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,",",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"fnext",5);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,",",1);
  poVar2 = (ostream *)std::ostream::operator<<(local_190,0x44);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,") \n ",4);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1c0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline uint fnext ( uint t ) const {ASSERT(is_in_range(t,0,m_tris.size()) && has_fnext(t));return m_tris[t].fnext;}